

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void vsencoding::__vseblocks_unpack20(uint32_t *out,uint32_t *in,uint32_t bs)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar9._8_8_ = 0x400000010;
  auVar9._0_8_ = 0x400000010;
  auVar10._8_8_ = 0xffff0000f0000;
  auVar10._0_8_ = 0xffff0000f0000;
  auVar5 = vpmovsxbd_avx(ZEXT416(0x1c100418));
  auVar11._8_4_ = 0xfffff;
  auVar11._0_8_ = 0xfffff000fffff;
  auVar11._12_4_ = 0xfffff;
  uVar7 = bs + 0x1f >> 5;
  while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
    uVar2 = *in;
    uVar1 = *(ulong *)(in + 1);
    uVar3 = in[4];
    *out = uVar2 >> 0xc;
    uVar4 = in[3];
    auVar14 = vpinsrd_avx(auVar11,(uVar2 & 0xfff) << 8,0);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar1;
    auVar6 = vpsllvd_avx2(auVar12,auVar9);
    auVar12 = vpmovzxdq_avx(auVar12);
    auVar6 = vpand_avx(auVar6,auVar10);
    auVar14 = vpunpcklqdq_avx(auVar14,auVar6);
    auVar6 = vpinsrd_avx(auVar12,uVar4,3);
    auVar6 = vpshufd_avx(auVar6,0xe0);
    auVar6 = vpsrlvd_avx2(auVar6,auVar5);
    auVar14 = vpor_avx(auVar6,auVar14);
    auVar6 = vpand_avx(auVar6,auVar11);
    auVar6 = vpblendd_avx2(auVar14,auVar6,2);
    *(undefined1 (*) [16])(out + 1) = auVar6;
    out[5] = uVar4 >> 8 & 0xfffff;
    uVar2 = in[5];
    uVar1 = *(ulong *)(in + 6);
    out[6] = (uVar4 & 0xff) << 0xc | uVar3 >> 0x14;
    out[7] = uVar3 & 0xfffff;
    uVar3 = in[0xe];
    out[8] = uVar2 >> 0xc;
    uVar4 = in[8];
    auVar14 = vpinsrd_avx(auVar11,(uVar2 & 0xfff) << 8,0);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar1;
    auVar6 = vpsllvd_avx2(auVar13,auVar9);
    auVar12 = vpmovzxdq_avx(auVar13);
    auVar6 = vpand_avx(auVar6,auVar10);
    auVar14 = vpunpcklqdq_avx(auVar14,auVar6);
    auVar6 = vpinsrd_avx(auVar12,uVar4,3);
    auVar6 = vpshufd_avx(auVar6,0xe0);
    auVar6 = vpsrlvd_avx2(auVar6,auVar5);
    auVar14 = vpor_avx(auVar6,auVar14);
    auVar6 = vpand_avx(auVar6,auVar11);
    auVar6 = vpblendd_avx2(auVar14,auVar6,2);
    *(undefined1 (*) [16])(out + 9) = auVar6;
    out[0xd] = uVar4 >> 8 & 0xfffff;
    uVar2 = in[9];
    uVar1 = *(ulong *)(in + 0xb);
    out[0xe] = (uVar4 & 0xff) << 0xc | uVar2 >> 0x14;
    out[0xf] = uVar2 & 0xfffff;
    uVar2 = in[10];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar1;
    auVar6 = vpsllvd_avx2(auVar14,auVar9);
    auVar12 = vpmovzxdq_avx(auVar14);
    auVar6 = vpand_avx(auVar6,auVar10);
    out[0x10] = uVar2 >> 0xc;
    uVar4 = in[0xd];
    auVar14 = vpinsrd_avx(auVar11,(uVar2 & 0xfff) << 8,0);
    auVar14 = vpunpcklqdq_avx(auVar14,auVar6);
    auVar6 = vpinsrd_avx(auVar12,uVar4,3);
    auVar6 = vpshufd_avx(auVar6,0xe0);
    auVar6 = vpsrlvd_avx2(auVar6,auVar5);
    auVar14 = vpor_avx(auVar6,auVar14);
    auVar6 = vpand_avx(auVar6,auVar11);
    auVar6 = vpblendd_avx2(auVar14,auVar6,2);
    *(undefined1 (*) [16])(out + 0x11) = auVar6;
    out[0x15] = uVar4 >> 8 & 0xfffff;
    uVar2 = in[0xf];
    uVar1 = *(ulong *)(in + 0x10);
    out[0x16] = (uVar4 & 0xff) << 0xc | uVar3 >> 0x14;
    out[0x17] = uVar3 & 0xfffff;
    uVar3 = in[0x13];
    out[0x18] = uVar2 >> 0xc;
    uVar4 = in[0x12];
    in = in + 0x14;
    auVar14 = vpinsrd_avx(auVar11,(uVar2 & 0xfff) << 8,0);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar1;
    auVar6 = vpsllvd_avx2(auVar15,auVar9);
    auVar12 = vpmovzxdq_avx(auVar15);
    auVar6 = vpand_avx(auVar6,auVar10);
    auVar14 = vpunpcklqdq_avx(auVar14,auVar6);
    auVar6 = vpinsrd_avx(auVar12,uVar4,3);
    auVar6 = vpshufd_avx(auVar6,0xe0);
    auVar6 = vpsrlvd_avx2(auVar6,auVar5);
    auVar14 = vpor_avx(auVar6,auVar14);
    auVar6 = vpand_avx(auVar6,auVar11);
    auVar6 = vpblendd_avx2(auVar14,auVar6,2);
    *(undefined1 (*) [16])(out + 0x19) = auVar6;
    out[0x1d] = uVar4 >> 8 & 0xfffff;
    out[0x1e] = (uVar4 & 0xff) << 0xc | uVar3 >> 0x14;
    out[0x1f] = uVar3 & 0xfffff;
    out = out + 0x20;
  }
  return;
}

Assistant:

void __vseblocks_unpack20(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 20, --bs) {
    out[0] = in[0] >> 12;
    out[1] = (in[0] << 8) & 0x0fffff;
    out[1] |= in[1] >> 24;
    out[2] = (in[1] >> 4) & 0x0fffff;
    out[3] = (in[1] << 16) & 0x0fffff;
    out[3] |= in[2] >> 16;
    out[4] = (in[2] << 4) & 0x0fffff;
    out[4] |= in[3] >> 28;
    out[5] = (in[3] >> 8) & 0x0fffff;
    out[6] = (in[3] << 12) & 0x0fffff;
    out[6] |= in[4] >> 20;
    out[7] = in[4] & 0x0fffff;
    out[8] = in[5] >> 12;
    out[9] = (in[5] << 8) & 0x0fffff;
    out[9] |= in[6] >> 24;
    out[10] = (in[6] >> 4) & 0x0fffff;
    out[11] = (in[6] << 16) & 0x0fffff;
    out[11] |= in[7] >> 16;
    out[12] = (in[7] << 4) & 0x0fffff;
    out[12] |= in[8] >> 28;
    out[13] = (in[8] >> 8) & 0x0fffff;
    out[14] = (in[8] << 12) & 0x0fffff;
    out[14] |= in[9] >> 20;
    out[15] = in[9] & 0x0fffff;
    out[16] = in[10] >> 12;
    out[17] = (in[10] << 8) & 0x0fffff;
    out[17] |= in[11] >> 24;
    out[18] = (in[11] >> 4) & 0x0fffff;
    out[19] = (in[11] << 16) & 0x0fffff;
    out[19] |= in[12] >> 16;
    out[20] = (in[12] << 4) & 0x0fffff;
    out[20] |= in[13] >> 28;
    out[21] = (in[13] >> 8) & 0x0fffff;
    out[22] = (in[13] << 12) & 0x0fffff;
    out[22] |= in[14] >> 20;
    out[23] = in[14] & 0x0fffff;
    out[24] = in[15] >> 12;
    out[25] = (in[15] << 8) & 0x0fffff;
    out[25] |= in[16] >> 24;
    out[26] = (in[16] >> 4) & 0x0fffff;
    out[27] = (in[16] << 16) & 0x0fffff;
    out[27] |= in[17] >> 16;
    out[28] = (in[17] << 4) & 0x0fffff;
    out[28] |= in[18] >> 28;
    out[29] = (in[18] >> 8) & 0x0fffff;
    out[30] = (in[18] << 12) & 0x0fffff;
    out[30] |= in[19] >> 20;
    out[31] = in[19] & 0x0fffff;
  }
}